

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Parser::parse_assign_statement(Parser *this)

{
  pointer pTVar1;
  AbstractSyntaxNode *pAVar2;
  int iVar3;
  stringstream buffer;
  Type local_2f4;
  Token local_2f0;
  Token local_298;
  Token local_240;
  Token local_1e8;
  Type local_190 [98];
  
  local_190[0] = kAssignStatement;
  pAVar2 = AbstractSyntaxNode::add_child
                     (this->current_,local_190,
                      (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                      super__Vector_impl_data._M_start + this->index_ % this->total_);
  this->current_ = pAVar2;
  std::__cxx11::stringstream::stringstream((stringstream *)local_190);
  iVar3 = this->index_ % this->total_;
  pTVar1 = (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar1[iVar3].type_ == kIdentity) {
    if (pTVar1[(this->index_ + 1) % this->total_].type_ == kLeftBracket) {
      local_2f4 = kIdentityArray;
      pAVar2 = AbstractSyntaxNode::add_child(this->current_,&local_2f4,pTVar1 + iVar3);
      this->current_ = pAVar2;
      AbstractSyntaxNode::add_child
                (pAVar2,(this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl
                        .super__Vector_impl_data._M_start + this->index_ % this->total_);
      local_2f4 = kIdentity;
      match(&local_1e8,this,&local_2f4);
      Token::~Token(&local_1e8);
      if ((this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
          super__Vector_impl_data._M_start[this->index_ % this->total_].type_ == kLeftBracket) {
        parse_array(this);
      }
    }
    else {
      local_2f4 = kIdentity;
      pAVar2 = AbstractSyntaxNode::add_child(this->current_,&local_2f4,pTVar1 + iVar3);
      this->current_ = pAVar2;
      AbstractSyntaxNode::add_child
                (pAVar2,(this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl
                        .super__Vector_impl_data._M_start + this->index_ % this->total_);
      local_2f4 = kIdentity;
      match(&local_240,this,&local_2f4);
      Token::~Token(&local_240);
    }
    this->current_ = this->current_->parent_;
  }
  local_2f4 = kAssign;
  match(&local_298,this,&local_2f4);
  Token::~Token(&local_298);
  parse_expression(this);
  local_2f4 = kSemicolon;
  match(&local_2f0,this,&local_2f4);
  Token::~Token(&local_2f0);
  this->current_ = this->current_->parent_;
  std::__cxx11::stringstream::~stringstream((stringstream *)local_190);
  return;
}

Assistant:

void Parser::parse_assign_statement() {
    current_ = current_->add_child(Token::Type::kAssignStatement, forward_token());
    std::stringstream buffer;

    if (forward_token().type() == Token::Type::kIdentity && forward_token(2).type() == Token::Type::kLeftBracket) {
        current_ = current_->add_child(Token::Type::kIdentityArray, forward_token());
        current_->add_child(forward_token());
        match(Token::Type::kIdentity);
        if (forward_token().type() == Token::Type::kLeftBracket) {
            parse_array();
        }
        current_ = current_->parent();
    } else if (forward_token().type() == Token::Type::kIdentity) {
        current_ = current_->add_child(Token::Type::kIdentity, forward_token());
        current_->add_child(forward_token());
        match(Token::Type::kIdentity);
        current_ = current_->parent();
    }

    match(Token::Type::kAssign);
    parse_expression();
    match(Token::Type::kSemicolon);

    current_ = current_->parent();
}